

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int filterResources(int *resourceList,int resourceCount,long preferenceFlags,long requirementFlags,
                   PairedList *possibleResources)

{
  bool bVar1;
  reference ppVar2;
  size_type sVar3;
  ulong in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_R8;
  long resourceFlag;
  int resource;
  iterator it;
  int i_1;
  int i;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffff48;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffff50;
  value_type *in_stack_ffffffffffffff58;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *plVar4;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffff60;
  _Self local_90;
  _List_node_base *local_88;
  _List_node_base *local_80;
  _Self local_78;
  ulong local_70;
  int local_64;
  _Self local_60;
  _Self local_58;
  int local_50;
  pair<int,_int> local_4c;
  int local_44;
  int local_40;
  pair<int,_int> local_3c;
  int local_34;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_30;
  ulong local_28;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  if ((in_RDI == 0) || (in_ESI == 0)) {
    for (local_34 = 0; local_34 < rsrcList->length; local_34 = local_34 + 1) {
      local_40 = scoreFlags(local_20,rsrcList->list[local_34].supportFlags);
      local_3c = std::make_pair<int,int&>((int *)in_stack_ffffffffffffff48,(int *)0x11fe88);
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    for (local_44 = 0; local_44 < local_14; local_44 = local_44 + 1) {
      plVar4 = local_30;
      local_50 = scoreFlags(local_20,rsrcList->list[*(int *)(local_10 + (long)local_44 * 4)].
                                     supportFlags);
      local_4c = std::make_pair<int,int&>((int *)in_stack_ffffffffffffff48,(int *)0x11ff35);
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (plVar4,in_stack_ffffffffffffff58);
    }
  }
  if (local_28 != 0) {
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                   (in_stack_ffffffffffffff48);
    while( true ) {
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                     (in_stack_ffffffffffffff48);
      bVar1 = std::operator!=(&local_58,&local_60);
      if (!bVar1) break;
      ppVar2 = std::_List_iterator<std::pair<int,_int>_>::operator*
                         ((_List_iterator<std::pair<int,_int>_> *)0x11ffb0);
      local_64 = ppVar2->second;
      local_70 = rsrcList->list[local_64].supportFlags;
      if ((long)(local_70 & local_28) < (long)local_28) {
        local_78._M_node =
             (_List_node_base *)
             std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                       (in_stack_ffffffffffffff48);
        bVar1 = std::operator==(&local_58,&local_78);
        if (bVar1) {
          plVar4 = local_30;
          ppVar2 = std::_List_iterator<std::pair<int,_int>_>::operator*
                             ((_List_iterator<std::pair<int,_int>_> *)0x120032);
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::remove
                    (plVar4,(char *)ppVar2);
          local_80 = (_List_node_base *)
                     std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                     ::begin(in_stack_ffffffffffffff48);
          local_58._M_node = local_80;
        }
        else {
          in_stack_ffffffffffffff50 = local_30;
          local_88 = (_List_node_base *)
                     std::_List_iterator<std::pair<int,_int>_>::operator--(&local_58,0);
          ppVar2 = std::_List_iterator<std::pair<int,_int>_>::operator*
                             ((_List_iterator<std::pair<int,_int>_> *)0x120085);
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::remove
                    (in_stack_ffffffffffffff50,(char *)ppVar2);
        }
      }
      local_90._M_node =
           (_List_node_base *)
           std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                     (in_stack_ffffffffffffff48);
      bVar1 = std::operator==(&local_58,&local_90);
      if (bVar1) break;
      std::_List_iterator<std::pair<int,_int>_>::operator++(&local_58);
    }
  }
  sVar3 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    (in_stack_ffffffffffffff50);
  if (sVar3 == 0) {
    local_4 = -6;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int filterResources(int* resourceList,
                    int resourceCount,
                    long preferenceFlags,
                    long requirementFlags,
                    PairedList* possibleResources) {

    // First determine a list of possible resources
    if (resourceList == NULL || resourceCount == 0) { // No list given
        for(int i=0; i<rsrcList->length; i++)
            possibleResources->push_back(std::make_pair(
                scoreFlags(preferenceFlags,rsrcList->list[i].supportFlags), // Score
                i)); // ID
    } else {
        for(int i=0; i<resourceCount; i++)
            possibleResources->push_back(std::make_pair(
                scoreFlags(preferenceFlags,rsrcList->list[resourceList[i]].supportFlags), // Score
                resourceList[i])); // ID
    }

    if (requirementFlags != 0) { // If requirements given do restriction
        for(PairedList::iterator it = possibleResources->begin();
            it != possibleResources->end(); ++it) {
            int resource = (*it).second;
            long resourceFlag = rsrcList->list[resource].supportFlags;
            if ( (resourceFlag & requirementFlags) < requirementFlags) {
                if(it==possibleResources->begin()){
                    possibleResources->remove(*(it));
                    it=possibleResources->begin();
                }else
                    possibleResources->remove(*(it--));
            }
            if(it==possibleResources->end())
                break;
        }
    }

    if (possibleResources->size() == 0) {
        return BEAGLE_ERROR_NO_RESOURCE;
    }

    return BEAGLE_SUCCESS;
}